

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmMakefile *this_00;
  string *psVar4;
  cmComputeLinkInformation *this_01;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  string new_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string for_build;
  string for_install_1;
  string local_e0;
  string for_build_1;
  string installNameTool;
  string for_install;
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == SHARED_LIBRARY ||
       (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY)) ||
      (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == EXECUTABLE)))) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&install_name_remap,"CMAKE_INSTALL_NAME_TOOL",(allocator<char> *)&for_build
              );
    psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&install_name_remap);
    std::__cxx11::string::string((string *)&installNameTool,(string *)psVar4);
    std::__cxx11::string::~string((string *)&install_name_remap);
    if (installNameTool._M_string_length != 0) {
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        psVar5 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_01);
        for (p_Var7 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          pcVar1 = *(cmGeneratorTarget **)(p_Var7 + 1);
          bVar2 = cmGeneratorTarget::IsImported(pcVar1);
          if (!bVar2) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&for_build,pcVar1,config);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&new_id,"${CMAKE_INSTALL_PREFIX}",(allocator<char> *)&for_build_1);
            cmGeneratorTarget::GetInstallNameDirForInstallTree(&for_install,pcVar1,config,&new_id);
            std::__cxx11::string::~string((string *)&new_id);
            bVar2 = std::operator!=(&for_build,&for_install);
            if (bVar2) {
              GetInstallFilename(&new_id,pcVar1,config,NameSO);
              std::__cxx11::string::append((string *)&for_build);
              std::__cxx11::string::append((string *)&for_install);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&install_name_remap,&for_build);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::~string((string *)&new_id);
            }
            std::__cxx11::string::~string((string *)&for_install);
            std::__cxx11::string::~string((string *)&for_build);
          }
        }
      }
      new_id._M_dataplus._M_p = (pointer)&new_id.field_2;
      new_id._M_string_length = 0;
      new_id.field_2._M_local_buf[0] = '\0';
      TVar3 = cmGeneratorTarget::GetType(this->Target);
      if (TVar3 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&for_build_1,this->Target,config);
        pcVar1 = this->Target;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&for_build,"${CMAKE_INSTALL_PREFIX}",(allocator<char> *)&for_install);
        cmGeneratorTarget::GetInstallNameDirForInstallTree(&for_install_1,pcVar1,config,&for_build);
        std::__cxx11::string::~string((string *)&for_build);
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        bVar2 = std::operator!=(&for_build_1,&for_install_1);
        if (bVar2) {
          for_build._M_dataplus._M_p = (pointer)for_install_1._M_string_length;
          for_build._M_string_length = (size_type)for_install_1._M_dataplus._M_p;
          GetInstallFilename(&local_e0,this->Target,config,NameSO);
          for_install._M_dataplus._M_p = (pointer)local_e0._M_string_length;
          for_install._M_string_length = (size_type)local_e0._M_dataplus._M_p;
          cmStrCat<>(&local_50,(cmAlphaNum *)&for_build,(cmAlphaNum *)&for_install);
          std::__cxx11::string::operator=((string *)&new_id,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::__cxx11::string::~string((string *)&for_install_1);
        std::__cxx11::string::~string((string *)&for_build_1);
      }
      if (install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
          new_id._M_string_length != 0) {
        poVar8 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar8 = std::operator<<(poVar8,"execute_process(COMMAND \"");
        std::operator<<(poVar8,(string *)&installNameTool);
        std::operator<<(os,"\"");
        p_Var9 = install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (new_id._M_string_length != 0) {
          poVar8 = std::operator<<(os,"\n");
          poVar8 = ::operator<<(poVar8,(cmScriptGeneratorIndent)indent.Level);
          poVar8 = std::operator<<(poVar8,"  -id \"");
          poVar8 = std::operator<<(poVar8,(string *)&new_id);
          std::operator<<(poVar8,"\"");
          p_Var9 = install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        for (; (_Rb_tree_header *)p_Var9 != &install_name_remap._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          poVar8 = std::operator<<(os,"\n");
          poVar8 = ::operator<<(poVar8,(cmScriptGeneratorIndent)indent.Level);
          poVar8 = std::operator<<(poVar8,"  -change \"");
          poVar8 = std::operator<<(poVar8,(string *)(p_Var9 + 1));
          poVar8 = std::operator<<(poVar8,"\" \"");
          poVar8 = std::operator<<(poVar8,(string *)(p_Var9 + 2));
          std::operator<<(poVar8,"\"");
        }
        poVar8 = std::operator<<(os,"\n");
        poVar8 = ::operator<<(poVar8,(cmScriptGeneratorIndent)indent.Level);
        poVar8 = std::operator<<(poVar8,"  \"");
        poVar8 = std::operator<<(poVar8,(string *)toDestDirPath);
        std::operator<<(poVar8,"\")\n");
      }
      std::__cxx11::string::~string((string *)&new_id);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&install_name_remap._M_t);
    }
    std::__cxx11::string::~string((string *)&installNameTool);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree(
        config, "${CMAKE_INSTALL_PREFIX}");
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree(
      config, "${CMAKE_INSTALL_PREFIX}");

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = cmStrCat(
        for_install, this->GetInstallFilename(this->Target, config, NameSO));
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}